

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.h
# Opt level: O0

void __thiscall
Assimp::ColladaMeshIndex::ColladaMeshIndex
          (ColladaMeshIndex *this,string *pMeshID,size_t pSubMesh,string *pMaterial)

{
  string *pMaterial_local;
  size_t pSubMesh_local;
  string *pMeshID_local;
  ColladaMeshIndex *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)pMeshID);
  this->mSubMesh = pSubMesh;
  std::__cxx11::string::string((string *)&this->mMaterial,(string *)pMaterial);
  return;
}

Assistant:

ColladaMeshIndex( const std::string& pMeshID, size_t pSubMesh, const std::string& pMaterial)
        : mMeshID( pMeshID), mSubMesh( pSubMesh), mMaterial( pMaterial)
    {   }